

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scheme.cpp
# Opt level: O1

void __thiscall implementations::scheme::environment::~environment(environment *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  p_Var1 = (this->outer_).
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_implementations::scheme::cell>_>_>
  ::~_Rb_tree(&(this->env_)._M_t);
  p_Var1 = (this->
           super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
           ).value.env.
           super___shared_ptr<implementations::scheme::environment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>::
  ~vector(&(this->
           super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
           ).value.list);
  pcVar2 = (this->
           super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
           ).value.val._M_dataplus._M_p;
  paVar3 = &(this->
            super_Environment<std::vector<implementations::scheme::cell,_std::allocator<implementations::scheme::cell>_>_>
            ).value.val.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

environment(env_p outer = nullptr) : outer_(outer) {}